

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_php_struct_definition
          (t_php_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool is_result)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  t_type *ptVar6;
  t_const_value *ptVar7;
  reference pptVar8;
  string *psVar9;
  undefined4 extraout_var;
  char *pcVar10;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_200
  ;
  t_field **local_1f8;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  t_type *local_190;
  t_type *t_1;
  t_field **local_180;
  string local_178;
  string local_158;
  allocator local_131;
  string local_130 [8];
  string param;
  string local_108 [8];
  string access;
  t_type *t;
  string local_b8 [8];
  string dval;
  string local_88;
  string local_58;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_38;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  bool is_result_local;
  bool is_exception_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_38);
  generate_php_doc(this,out,(t_doc *)tstruct);
  poVar4 = std::operator<<(out,"class ");
  php_namespace_declaration_abi_cxx11_(&local_58,this,&tstruct->super_t_type);
  std::operator<<(poVar4,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (is_exception) {
    poVar4 = std::operator<<(out," extends ");
    std::operator<<(poVar4,"TException");
  }
  else if ((this->oop_ & 1U) != 0) {
    poVar4 = std::operator<<(out," extends ");
    std::operator<<(poVar4,"TBase");
  }
  if ((this->json_serializable_ & 1U) != 0) {
    std::operator<<(out," implements JsonSerializable");
  }
  poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_88);
  poVar4 = std::operator<<(poVar4,"static public $isValidate = ");
  pcVar10 = "false";
  if ((this->validate_ & 1U) != 0) {
    pcVar10 = "true";
  }
  poVar4 = std::operator<<(poVar4,pcVar10);
  poVar4 = std::operator<<(poVar4,";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_88);
  generate_php_struct_spec(this,out,tstruct);
  local_38._M_current =
       (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  while( true ) {
    dval.field_2._8_8_ =
         std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                   ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&dval.field_2 + 8));
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"null",(allocator *)((long)&t + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&t + 7));
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    ptVar6 = t_field::get_type(*pptVar8);
    ptVar6 = t_generator::get_true_type(ptVar6);
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    ptVar7 = t_field::get_value(*pptVar8);
    if (((ptVar7 != (t_const_value *)0x0) &&
        (uVar2 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xb])(), (uVar2 & 1) == 0)) &&
       (uVar2 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xc])(), (uVar2 & 1) == 0)) {
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      ptVar6 = t_field::get_type(*pptVar8);
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      ptVar7 = t_field::get_value(*pptVar8);
      render_const_value_abi_cxx11_((string *)((long)&access.field_2 + 8),this,ptVar6,ptVar7);
      std::__cxx11::string::operator=(local_b8,(string *)(access.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(access.field_2._M_local_buf + 8));
    }
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    generate_php_doc(this,out,*pptVar8);
    pcVar10 = "public";
    if ((this->getters_setters_ & 1U) != 0) {
      pcVar10 = "private";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,pcVar10,(allocator *)(param.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(param.field_2._M_local_buf + 0xf));
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,local_108);
    poVar4 = std::operator<<(poVar4," $");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
    poVar4 = std::operator<<(poVar4,(string *)psVar9);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,local_b8);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_b8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_38);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  sVar5 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
  pcVar10 = "";
  if (sVar5 != 0) {
    pcVar10 = "$vals = null";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,pcVar10,&local_131);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"public function __construct(");
  poVar4 = std::operator<<(poVar4,local_130);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_178);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_up((t_generator *)this);
  sVar5 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
  if (sVar5 != 0) {
    local_180 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
    local_38._M_current = local_180;
    while( true ) {
      t_1 = (t_type *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&t_1);
      if (!bVar1) break;
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      ptVar6 = t_field::get_type(*pptVar8);
      local_190 = t_generator::get_true_type(ptVar6);
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      ptVar7 = t_field::get_value(*pptVar8);
      if ((ptVar7 != (t_const_value *)0x0) &&
         ((uVar2 = (*(local_190->super_t_doc)._vptr_t_doc[0xb])(), (uVar2 & 1) != 0 ||
          (uVar2 = (*(local_190->super_t_doc)._vptr_t_doc[0xc])(), (uVar2 & 1) != 0)))) {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"$this->");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_38);
        psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
        poVar4 = std::operator<<(poVar4,(string *)psVar9);
        poVar4 = std::operator<<(poVar4," = ");
        ptVar6 = local_190;
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_38);
        ptVar7 = t_field::get_value(*pptVar8);
        render_const_value_abi_cxx11_(&local_1b0,this,ptVar6,ptVar7);
        poVar4 = std::operator<<(poVar4,(string *)&local_1b0);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_38);
    }
    t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1d0);
    poVar4 = std::operator<<(poVar4,"if (is_array($vals)) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1d0);
    t_generator::indent_up((t_generator *)this);
    if ((this->oop_ & 1U) == 0) {
      local_1f8 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
      local_38._M_current = local_1f8;
      while( true ) {
        local_200._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_38,&local_200);
        if (!bVar1) break;
        t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_220);
        poVar4 = std::operator<<(poVar4,"if (isset($vals[\'");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_38);
        psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
        poVar4 = std::operator<<(poVar4,(string *)psVar9);
        poVar4 = std::operator<<(poVar4,"\'])) {");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_220);
        t_generator::indent_up((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_240);
        poVar4 = std::operator<<(poVar4,"$this->");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_38);
        psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
        poVar4 = std::operator<<(poVar4,(string *)psVar9);
        poVar4 = std::operator<<(poVar4," = $vals[\'");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_38);
        psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
        poVar4 = std::operator<<(poVar4,(string *)psVar9);
        poVar4 = std::operator<<(poVar4,"\'];");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_240);
        t_generator::indent_down((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_260,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_260);
        poVar4 = std::operator<<(poVar4,"}");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_260);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_38);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_1f0);
      poVar4 = std::operator<<(poVar4,"parent::__construct(self::$_TSPEC, $vals);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_280);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_280);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_2a0);
  poVar4 = std::operator<<(poVar4,"public function getName()");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_2c0);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_2e0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_2e0);
  poVar4 = std::operator<<(poVar4,"return \'");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
  poVar4 = std::operator<<(poVar4,"\';");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2e0);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_300,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_300);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_300);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  if ((this->getters_setters_ & 1U) != 0) {
    generate_generic_field_getters_setters(this,out,tstruct);
  }
  generate_php_struct_reader(this,out,tstruct,is_result);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  generate_php_struct_writer(this,out,tstruct,is_result);
  bVar1 = needs_php_read_validator(this,tstruct,is_result);
  if (bVar1) {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    generate_php_struct_read_validator(this,out,tstruct);
  }
  bVar1 = needs_php_write_validator(this,tstruct,is_result);
  if (bVar1) {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    generate_php_struct_write_validator(this,out,tstruct);
  }
  if ((this->json_serializable_ & 1U) != 0) {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    generate_php_struct_json_serialize(this,out,tstruct,is_result);
  }
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_320,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_320);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string(local_130);
  return;
}

Assistant:

void t_php_generator::generate_php_struct_definition(ostream& out,
                                                     t_struct* tstruct,
                                                     bool is_exception,
                                                     bool is_result) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  generate_php_doc(out, tstruct);
  out << "class " << php_namespace_declaration(tstruct);
  if (is_exception) {
    out << " extends "
        << "TException";
  } else if (oop_) {
    out << " extends "
        << "TBase";
  }
  if (json_serializable_) {
    out << " implements JsonSerializable";
  }
  out << endl
      << "{" << endl;
  indent_up();

  out << indent() << "static public $isValidate = " << (validate_ ? "true" : "false") << ";" << endl << endl;

  generate_php_struct_spec(out, tstruct);

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    string dval = "null";
    t_type* t = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr && !(t->is_struct() || t->is_xception())) {
      dval = render_const_value((*m_iter)->get_type(), (*m_iter)->get_value());
    }
    generate_php_doc(out, *m_iter);
    string access = (getters_setters_) ? "private" : "public";
    indent(out) << access << " $" << (*m_iter)->get_name() << " = " << dval << ";" << endl;
  }

  out << endl;

  // Generate constructor from array
  string param = (members.size() > 0) ? "$vals = null" : "";
  out << indent() << "public function __construct(" << param << ")"<< endl
      << indent() << "{" << endl;
  indent_up();

  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if ((*m_iter)->get_value() != nullptr && (t->is_struct() || t->is_xception())) {
        indent(out) << "$this->" << (*m_iter)->get_name() << " = "
                    << render_const_value(t, (*m_iter)->get_value()) << ";" << endl;
      }
    }
    out << indent() << "if (is_array($vals)) {" << endl;
    indent_up();
    if (oop_) {
      out << indent() << "parent::__construct(self::$_TSPEC, $vals);" << endl;
    } else {
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        out << indent() << "if (isset($vals['" << (*m_iter)->get_name() << "'])) {" << endl;

        indent_up();
        out << indent() << "$this->" << (*m_iter)->get_name() << " = $vals['"
            << (*m_iter)->get_name() << "'];" << endl;

        indent_down();
        out << indent() << "}" << endl;
      }
    }
    indent_down();
    out << indent() << "}" << endl;
  }
  scope_down(out);
  out << endl;

  out << indent() << "public function getName()" << endl
      << indent() << "{" << endl;

  indent_up();
  out << indent() << "return '" << tstruct->get_name() << "';" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;

  out << endl;
  if (getters_setters_) {
    generate_generic_field_getters_setters(out, tstruct);
  }
  generate_php_struct_reader(out, tstruct, is_result);
  out << endl;
  generate_php_struct_writer(out, tstruct, is_result);
  if (needs_php_read_validator(tstruct, is_result)) {
    out << endl;
    generate_php_struct_read_validator(out, tstruct);
  }
  if (needs_php_write_validator(tstruct, is_result)) {
    out << endl;
    generate_php_struct_write_validator(out, tstruct);
  }
  if (json_serializable_) {
    out << endl;
    generate_php_struct_json_serialize(out, tstruct, is_result);
  }

  indent_down();
  out << indent() << "}" << endl;
}